

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void lyplg_ext_print_info_extension_instance(lyspr_ctx *ctx,lysc_ext_instance *ext,ly_bool *flag)

{
  ly_stmt lVar1;
  uint uVar2;
  void *pvVar3;
  bool bVar4;
  char *pcVar5;
  LY_DATA_TYPE basetype;
  ulong local_b8;
  ulong local_a8;
  ulong local_98;
  void **local_80;
  lysc_pattern *patterns;
  lysc_must *musts;
  uint32_t max;
  lysc_ident *idents;
  lysc_type_bitenum_item *items;
  lysc_node *node;
  ulong uStack_38;
  ly_bool data_printed;
  uint64_t v;
  uint64_t u;
  lys_ypr_ctx *pctx;
  ly_bool *flag_local;
  lysc_ext_instance *ext_local;
  lyspr_ctx *ctx_local;
  
  bVar4 = false;
  v = 0;
  do {
    if (ext->substmts == (lysc_ext_substmt *)0x0) {
      local_80 = (void **)0x0;
    }
    else {
      local_80 = ext->substmts[-1].storage_p;
    }
    if (local_80 <= v) {
      return;
    }
    lVar1 = ext->substmts[v].stmt;
    if (((((lVar1 - LY_STMT_NOTIFICATION < 2) || (lVar1 == LY_STMT_OUTPUT)) ||
         (lVar1 == LY_STMT_ACTION)) || ((lVar1 == LY_STMT_RPC || (lVar1 == LY_STMT_ANYDATA)))) ||
       (lVar1 == LY_STMT_ANYXML)) {
LAB_001ea2c5:
      if (!bVar4) {
        for (items = (lysc_type_bitenum_item *)*ext->substmts[v].storage_p;
            items != (lysc_type_bitenum_item *)0x0; items = (lysc_type_bitenum_item *)items->exts) {
          ypr_open(ctx->out,flag);
          if (ext->substmts[v].stmt == LY_STMT_NOTIFICATION) {
            yprc_notification((lys_ypr_ctx *)ctx,(lysc_node_notif *)items);
          }
          else if ((ext->substmts[v].stmt & (LY_STMT_OUTPUT|LY_STMT_INPUT)) == LY_STMT_NONE) {
            if ((ext->substmts[v].stmt & (LY_STMT_RPC|LY_STMT_ACTION)) == LY_STMT_NONE) {
              yprc_node((lys_ypr_ctx *)ctx,(lysc_node *)items);
            }
            else {
              yprc_action((lys_ypr_ctx *)ctx,(lysc_node_action *)items);
            }
          }
          else {
            yprc_inout((lys_ypr_ctx *)ctx,(lysc_node_action_inout *)items,flag);
          }
        }
        bVar4 = true;
      }
    }
    else if (lVar1 != LY_STMT_AUGMENT) {
      if (((lVar1 == LY_STMT_CASE) || (lVar1 == LY_STMT_CHOICE)) || (lVar1 == LY_STMT_CONTAINER))
      goto LAB_001ea2c5;
      if (lVar1 != LY_STMT_GROUPING) {
        if ((((lVar1 == LY_STMT_LEAF) || (lVar1 == LY_STMT_LEAF_LIST)) || (lVar1 == LY_STMT_LIST))
           || (lVar1 == LY_STMT_USES)) goto LAB_001ea2c5;
        if (lVar1 == LY_STMT_ARGUMENT) goto LAB_001ea3b9;
        if ((lVar1 != LY_STMT_BASE) && (lVar1 != LY_STMT_BELONGS_TO)) {
          if (lVar1 == LY_STMT_BIT) {
LAB_001ea431:
            basetype = LY_TYPE_ENUM;
            if (ext->substmts[v].stmt == LY_STMT_BIT) {
              basetype = LY_TYPE_BITS;
            }
            yprc_bits_enum((lys_ypr_ctx *)ctx,(lysc_type_bitenum_item *)*ext->substmts[v].storage_p,
                           basetype,flag);
          }
          else if (lVar1 == LY_STMT_CONFIG) {
            ypr_config((lys_ypr_ctx *)ctx,*(uint16_t *)ext->substmts[v].storage_p,ext->exts,flag);
          }
          else if (lVar1 == LY_STMT_CONTACT) {
LAB_001ea3b9:
            if (*ext->substmts[v].storage_p != (void *)0x0) {
              ypr_open(ctx->out,flag);
              ypr_substmt((lys_ypr_ctx *)ctx,ext->substmts[v].stmt,'\0',
                          (char *)*ext->substmts[v].storage_p,'\0',ext->exts);
            }
          }
          else if (lVar1 != LY_STMT_DEFAULT) {
            if (lVar1 == LY_STMT_DESCRIPTION) goto LAB_001ea3b9;
            if ((lVar1 != LY_STMT_DEVIATE) && (lVar1 != LY_STMT_DEVIATION)) {
              if (lVar1 == LY_STMT_ENUM) goto LAB_001ea431;
              if ((lVar1 == LY_STMT_ERROR_APP_TAG) || (lVar1 == LY_STMT_ERROR_MESSAGE))
              goto LAB_001ea3b9;
              if (lVar1 != LY_STMT_EXTENSION) {
                if (lVar1 == LY_STMT_EXTENSION_INSTANCE) {
                  yprc_extension_instances
                            ((lys_ypr_ctx *)ctx,LY_STMT_EXTENSION_INSTANCE,'\0',
                             (lysc_ext_instance *)*ext->substmts[v].storage_p,flag);
                }
                else if (lVar1 != LY_STMT_FEATURE) {
                  if (lVar1 == LY_STMT_FRACTION_DIGITS) {
                    if (*ext->substmts[v].storage_p != (void *)0x0) {
                      ypr_unsigned((lys_ypr_ctx *)ctx,LY_STMT_FRACTION_DIGITS,'\0',ext->exts,
                                   (unsigned_long)*ext->substmts[v].storage_p,flag);
                    }
                  }
                  else if (lVar1 == LY_STMT_IDENTITY) {
                    pvVar3 = *ext->substmts[v].storage_p;
                    uStack_38 = 0;
                    while( true ) {
                      if (pvVar3 == (void *)0x0) {
                        local_98 = 0;
                      }
                      else {
                        local_98 = *(ulong *)((long)pvVar3 + -8);
                      }
                      if (local_98 <= uStack_38) break;
                      yprc_identity((lys_ypr_ctx *)ctx,
                                    (lysc_ident *)((long)pvVar3 + uStack_38 * 0x38));
                      uStack_38 = uStack_38 + 1;
                    }
                  }
                  else if (((lVar1 != LY_STMT_IF_FEATURE) && (lVar1 != LY_STMT_IMPORT)) &&
                          (lVar1 != LY_STMT_INCLUDE)) {
                    if (lVar1 == LY_STMT_KEY) goto LAB_001ea3b9;
                    if (lVar1 == LY_STMT_LENGTH) {
                      if (*ext->substmts[v].storage_p != (void *)0x0) {
                        yprc_range((lys_ypr_ctx *)ctx,(lysc_range *)*ext->substmts[v].storage_p,
                                   LY_TYPE_STRING,flag);
                      }
                    }
                    else if (lVar1 == LY_STMT_MANDATORY) {
                      ypr_mandatory((lys_ypr_ctx *)ctx,*(uint16_t *)ext->substmts[v].storage_p,
                                    ext->exts,flag);
                    }
                    else if (lVar1 == LY_STMT_MAX_ELEMENTS) {
                      uVar2 = *(uint *)ext->substmts[v].storage_p;
                      if (uVar2 == 0) {
                        ypr_open(ctx->out,flag);
                        ypr_substmt((lys_ypr_ctx *)ctx,LY_STMT_MAX_ELEMENTS,'\0',"unbounded",'\0',
                                    ext->exts);
                      }
                      else {
                        ypr_unsigned((lys_ypr_ctx *)ctx,LY_STMT_MAX_ELEMENTS,'\0',ext->exts,
                                     (ulong)uVar2,flag);
                      }
                    }
                    else if (lVar1 == LY_STMT_MIN_ELEMENTS) {
                      ypr_unsigned((lys_ypr_ctx *)ctx,LY_STMT_MIN_ELEMENTS,'\0',ext->exts,
                                   (ulong)*(uint *)ext->substmts[v].storage_p,flag);
                    }
                    else {
                      if (lVar1 == LY_STMT_MODIFIER) goto LAB_001ea3b9;
                      if (lVar1 != LY_STMT_MODULE) {
                        if (lVar1 == LY_STMT_MUST) {
                          pvVar3 = *ext->substmts[v].storage_p;
                          uStack_38 = 0;
                          while( true ) {
                            if (pvVar3 == (void *)0x0) {
                              local_a8 = 0;
                            }
                            else {
                              local_a8 = *(ulong *)((long)pvVar3 + -8);
                            }
                            if (local_a8 <= uStack_38) break;
                            yprc_must((lys_ypr_ctx *)ctx,
                                      (lysc_must *)((long)pvVar3 + uStack_38 * 0x38),flag);
                            uStack_38 = uStack_38 + 1;
                          }
                        }
                        else {
                          if (lVar1 == LY_STMT_NAMESPACE) goto LAB_001ea3b9;
                          if (lVar1 == LY_STMT_ORDERED_BY) {
                            ypr_open(ctx->out,flag);
                            pcVar5 = "system";
                            if (((ulong)*ext->substmts[v].storage_p & 0x40) != 0) {
                              pcVar5 = "user";
                            }
                            ypr_substmt((lys_ypr_ctx *)ctx,LY_STMT_ORDERED_BY,'\0',pcVar5,'\0',
                                        ext->exts);
                          }
                          else {
                            if (lVar1 == LY_STMT_ORGANIZATION) goto LAB_001ea3b9;
                            if (lVar1 != LY_STMT_PATH) {
                              if (lVar1 == LY_STMT_PATTERN) {
                                pvVar3 = *ext->substmts[v].storage_p;
                                uStack_38 = 0;
                                while( true ) {
                                  if (pvVar3 == (void *)0x0) {
                                    local_b8 = 0;
                                  }
                                  else {
                                    local_b8 = *(ulong *)((long)pvVar3 + -8);
                                  }
                                  if (local_b8 <= uStack_38) break;
                                  yprc_pattern((lys_ypr_ctx *)ctx,
                                               (lysc_pattern *)((long)pvVar3 + uStack_38 * 0x40),
                                               flag);
                                  uStack_38 = uStack_38 + 1;
                                }
                              }
                              else if (lVar1 == LY_STMT_POSITION) {
                                if (*ext->substmts[v].storage_p != (void *)0x0) {
                                  ypr_unsigned((lys_ypr_ctx *)ctx,ext->substmts[v].stmt,'\0',
                                               ext->exts,(unsigned_long)*ext->substmts[v].storage_p,
                                               flag);
                                }
                              }
                              else if (lVar1 != LY_STMT_PREFIX) {
                                if (lVar1 == LY_STMT_PRESENCE) goto LAB_001ea3b9;
                                if (lVar1 == LY_STMT_RANGE) {
                                  if (*ext->substmts[v].storage_p != (void *)0x0) {
                                    yprc_range((lys_ypr_ctx *)ctx,
                                               (lysc_range *)*ext->substmts[v].storage_p,
                                               LY_TYPE_UINT64,flag);
                                  }
                                }
                                else {
                                  if (lVar1 == LY_STMT_REFERENCE) goto LAB_001ea3b9;
                                  if (lVar1 != LY_STMT_REFINE) {
                                    if (lVar1 == LY_STMT_REQUIRE_INSTANCE) {
                                      ypr_open(ctx->out,flag);
                                      pcVar5 = "false";
                                      if (*(char *)ext->substmts[v].storage_p != '\0') {
                                        pcVar5 = "true";
                                      }
                                      ypr_substmt((lys_ypr_ctx *)ctx,LY_STMT_REQUIRE_INSTANCE,'\0',
                                                  pcVar5,'\0',ext->exts);
                                    }
                                    else if ((lVar1 != LY_STMT_REVISION) &&
                                            (lVar1 != LY_STMT_REVISION_DATE)) {
                                      if (lVar1 == LY_STMT_STATUS) {
                                        ypr_status((lys_ypr_ctx *)ctx,
                                                   *(uint16_t *)ext->substmts[v].storage_p,ext->exts
                                                   ,flag);
                                      }
                                      else if (lVar1 != LY_STMT_SUBMODULE) {
                                        if (lVar1 == LY_STMT_TYPE) {
                                          if (*ext->substmts[v].storage_p != (void *)0x0) {
                                            ypr_open(ctx->out,flag);
                                            yprc_type((lys_ypr_ctx *)ctx,
                                                      (lysc_type *)*ext->substmts[v].storage_p);
                                          }
                                        }
                                        else if ((lVar1 != LY_STMT_TYPEDEF) &&
                                                (lVar1 != LY_STMT_UNIQUE)) {
                                          if (lVar1 == LY_STMT_UNITS) goto LAB_001ea3b9;
                                          if (lVar1 == LY_STMT_VALUE) {
                                            if (*ext->substmts[v].storage_p != (void *)0x0) {
                                              ypr_signed((lys_ypr_ctx *)ctx,ext->substmts[v].stmt,
                                                         '\0',ext->exts,
                                                         (long)*ext->substmts[v].storage_p,flag);
                                            }
                                          }
                                          else if (lVar1 == LY_STMT_WHEN) {
                                            yprc_when((lys_ypr_ctx *)ctx,
                                                      (lysc_when *)*ext->substmts[v].storage_p,flag)
                                            ;
                                          }
                                          else if ((lVar1 != LY_STMT_YANG_VERSION) &&
                                                  (lVar1 != LY_STMT_YIN_ELEMENT)) {
                                            ly_log(ctx->module->ctx,LY_LLERR,LY_EINT,
                                                   "Internal error (%s:%d).",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_yang.c"
                                                  ,0xaa8);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    v = v + 1;
  } while( true );
}

Assistant:

LIBYANG_API_DEF void
lyplg_ext_print_info_extension_instance(struct lyspr_ctx *ctx, const struct lysc_ext_instance *ext, ly_bool *flag)
{
    struct lys_ypr_ctx *pctx = (struct lys_ypr_ctx *)ctx;
    LY_ARRAY_COUNT_TYPE u, v;
    ly_bool data_printed = 0;

    LY_ARRAY_FOR(ext->substmts, u) {
        switch (ext->substmts[u].stmt) {
        case LY_STMT_NOTIFICATION:
        case LY_STMT_INPUT:
        case LY_STMT_OUTPUT:
        case LY_STMT_ACTION:
        case LY_STMT_RPC:
        case LY_STMT_ANYDATA:
        case LY_STMT_ANYXML:
        case LY_STMT_CASE:
        case LY_STMT_CHOICE:
        case LY_STMT_CONTAINER:
        case LY_STMT_LEAF:
        case LY_STMT_LEAF_LIST:
        case LY_STMT_LIST:
        case LY_STMT_USES: {
            const struct lysc_node *node;

            if (data_printed) {
                break;
            }

            LY_LIST_FOR(*ext->substmts[u].storage_p, node) {
                ypr_open(pctx->out, flag);
                if (ext->substmts[u].stmt == LY_STMT_NOTIFICATION) {
                    yprc_notification(pctx, (struct lysc_node_notif *)node);
                } else if (ext->substmts[u].stmt & (LY_STMT_INPUT | LY_STMT_OUTPUT)) {
                    yprc_inout(pctx, (struct lysc_node_action_inout *)node, flag);
                } else if (ext->substmts[u].stmt & (LY_STMT_ACTION | LY_STMT_RPC)) {
                    yprc_action(pctx, (struct lysc_node_action *)node);
                } else {
                    yprc_node(pctx, node);
                }
            }

            /* all data nodes are stored in a linked list so all were printed */
            data_printed = 1;
            break;
        }
        case LY_STMT_ARGUMENT:
        case LY_STMT_CONTACT:
        case LY_STMT_DESCRIPTION:
        case LY_STMT_ERROR_APP_TAG:
        case LY_STMT_ERROR_MESSAGE:
        case LY_STMT_KEY:
        case LY_STMT_MODIFIER:
        case LY_STMT_NAMESPACE:
        case LY_STMT_ORGANIZATION:
        case LY_STMT_PRESENCE:
        case LY_STMT_REFERENCE:
        case LY_STMT_UNITS:
            if (*ext->substmts[u].storage_p) {
                ypr_open(pctx->out, flag);
                ypr_substmt(pctx, ext->substmts[u].stmt, 0, *ext->substmts[u].storage_p, 0, ext->exts);
            }
            break;
        case LY_STMT_BIT:
        case LY_STMT_ENUM: {
            const struct lysc_type_bitenum_item *items = *ext->substmts[u].storage_p;

            yprc_bits_enum(pctx, items, ext->substmts[u].stmt == LY_STMT_BIT ? LY_TYPE_BITS : LY_TYPE_ENUM, flag);
            break;
        }
        case LY_STMT_CONFIG:
            ypr_config(pctx, *(uint16_t *)ext->substmts[u].storage_p, ext->exts, flag);
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            yprc_extension_instances(pctx, LY_STMT_EXTENSION_INSTANCE, 0, *ext->substmts[u].storage_p, flag);
            break;
        case LY_STMT_FRACTION_DIGITS:
            if (*ext->substmts[u].storage_p) {
                ypr_unsigned(pctx, LY_STMT_FRACTION_DIGITS, 0, ext->exts,
                        (long unsigned int)*ext->substmts[u].storage_p, flag);
            }
            break;
        case LY_STMT_IDENTITY: {
            const struct lysc_ident *idents = *ext->substmts[u].storage_p;

            LY_ARRAY_FOR(idents, v) {
                yprc_identity(pctx, &idents[v]);
            }
            break;
        }
        case LY_STMT_LENGTH:
            if (*ext->substmts[u].storage_p) {
                yprc_range(pctx, *ext->substmts[u].storage_p, LY_TYPE_STRING, flag);
            }
            break;
        case LY_STMT_MANDATORY:
            ypr_mandatory(pctx, *(uint16_t *)ext->substmts[u].storage_p, ext->exts, flag);
            break;
        case LY_STMT_MAX_ELEMENTS: {
            uint32_t max = *(uint32_t *)ext->substmts[u].storage_p;

            if (max) {
                ypr_unsigned(pctx, LY_STMT_MAX_ELEMENTS, 0, ext->exts, max, flag);
            } else {
                ypr_open(pctx->out, flag);
                ypr_substmt(pctx, LY_STMT_MAX_ELEMENTS, 0, "unbounded", 0, ext->exts);
            }
            break;
        }
        case LY_STMT_MIN_ELEMENTS:
            ypr_unsigned(pctx, LY_STMT_MIN_ELEMENTS, 0, ext->exts, *(uint32_t *)ext->substmts[u].storage_p, flag);
            break;
        case LY_STMT_ORDERED_BY:
            ypr_open(pctx->out, flag);
            ypr_substmt(pctx, LY_STMT_ORDERED_BY, 0,
                    ((*(uint16_t *)ext->substmts[u].storage_p) & LYS_ORDBY_USER) ? "user" : "system", 0, ext->exts);
            break;
        case LY_STMT_MUST: {
            const struct lysc_must *musts = *ext->substmts[u].storage_p;

            LY_ARRAY_FOR(musts, v) {
                yprc_must(pctx, &musts[v], flag);
            }
            break;
        }
        case LY_STMT_PATTERN: {
            const struct lysc_pattern *patterns = *ext->substmts[u].storage_p;

            LY_ARRAY_FOR(patterns, v) {
                yprc_pattern(pctx, &patterns[v], flag);
            }
            break;
        }
        case LY_STMT_POSITION:
            if (*ext->substmts[u].storage_p) {
                ypr_unsigned(pctx, ext->substmts[u].stmt, 0, ext->exts, *(int64_t *)ext->substmts[u].storage_p, flag);
            }
            break;
        case LY_STMT_VALUE:
            if (*ext->substmts[u].storage_p) {
                ypr_signed(pctx, ext->substmts[u].stmt, 0, ext->exts, *(int64_t *)ext->substmts[u].storage_p, flag);
            }
            break;
        case LY_STMT_RANGE:
            if (*ext->substmts[u].storage_p) {
                yprc_range(pctx, *ext->substmts[u].storage_p, LY_TYPE_UINT64, flag);
            }
            break;
        case LY_STMT_REQUIRE_INSTANCE:
            ypr_open(pctx->out, flag);
            ypr_substmt(pctx, LY_STMT_REQUIRE_INSTANCE, 0, *(uint8_t *)ext->substmts[u].storage_p ? "true" : "false",
                    0, ext->exts);
            break;
        case LY_STMT_STATUS:
            ypr_status(pctx, *(uint16_t *)ext->substmts[u].storage_p, ext->exts, flag);
            break;
        case LY_STMT_TYPE:
            if (*ext->substmts[u].storage_p) {
                ypr_open(pctx->out, flag);
                yprc_type(pctx, *ext->substmts[u].storage_p);
            }
            break;
        case LY_STMT_WHEN:
            yprc_when(pctx, *ext->substmts[u].storage_p, flag);
            break;
        case LY_STMT_AUGMENT:
        case LY_STMT_BASE:
        case LY_STMT_BELONGS_TO:
        case LY_STMT_DEFAULT:
        case LY_STMT_DEVIATE:
        case LY_STMT_DEVIATION:
        case LY_STMT_EXTENSION:
        case LY_STMT_FEATURE:
        case LY_STMT_GROUPING:
        case LY_STMT_IF_FEATURE:
        case LY_STMT_IMPORT:
        case LY_STMT_INCLUDE:
        case LY_STMT_MODULE:
        case LY_STMT_PATH:
        case LY_STMT_PREFIX:
        case LY_STMT_REFINE:
        case LY_STMT_REVISION:
        case LY_STMT_REVISION_DATE:
        case LY_STMT_SUBMODULE:
        case LY_STMT_TYPEDEF:
        case LY_STMT_UNIQUE:
        case LY_STMT_YANG_VERSION:
        case LY_STMT_YIN_ELEMENT:
            /* nothing to do */
            break;
        default:
            LOGINT(pctx->module->ctx);
            break;
        }
    }
}